

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

void __thiscall llvm::DWARFVerifier::verifyDebugLineRows(DWARFVerifier *this)

{
  ushort uVar1;
  uint uVar2;
  DWARFContext *this_00;
  pointer pFVar3;
  pointer pRVar4;
  StringRef Key;
  StringRef Key_00;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  LineTable *pLVar8;
  raw_ostream *prVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  undefined **__n;
  char *__n_00;
  void *__buf;
  void *__buf_00;
  undefined8 in_R8;
  unsigned_long uVar13;
  DWARFUnit *this_01;
  pointer pFVar14;
  Row *Row;
  pointer this_02;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef Str_16;
  Optional<unsigned_long> OVar15;
  pair<llvm::StringMapIterator<unsigned_short>,_bool> pVar16;
  StringRef CompDir;
  format_object_base local_118;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_108;
  Optional<llvm::DWARFFormValue> local_100;
  ulong local_c8;
  StringMapEntryBase **local_c0;
  raw_ostream *local_b8;
  undefined8 *local_b0;
  undefined1 auStack_a8 [8];
  StringMap<unsigned_short,_llvm::MallocAllocator> FullPathMap;
  DWARFDie Die;
  undefined **local_60;
  undefined1 local_50 [8];
  string FullPath;
  
  this_00 = this->DCtx;
  DWARFContext::parseNormalUnits(this_00);
  uVar2 = (this_00->NormalUnits).NumInfoUnits;
  if (uVar2 == 0xffffffff) {
    uVar2 = (this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar2 != 0) {
    puVar7 = (undefined8 *)
             (this_00->NormalUnits).
             super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
             .
             super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
             .
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    local_b0 = puVar7 + uVar2;
    local_60 = &PTR_home_00d77818;
    do {
      this_01 = (DWARFUnit *)*puVar7;
      DWARFUnit::extractDIEsIfNeeded(this_01,true);
      if ((this_01->DieArray).
          super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this_01->DieArray).
          super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (DWARFUnit *)0x0;
      }
      FullPathMap._24_8_ = this_01;
      pLVar8 = DWARFContext::getLineTableForUnit(this->DCtx,(DWARFUnit *)*puVar7);
      if (pLVar8 != (LineTable *)0x0) {
        auStack_a8 = (undefined1  [8])0x0;
        FullPathMap.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
        FullPathMap.super_StringMapImpl.NumBuckets = 0;
        FullPathMap.super_StringMapImpl.NumItems = 0x10;
        pFVar14 = (pLVar8->Prologue).FileNames.
                  super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pFVar3 = (pLVar8->Prologue).FileNames.
                 super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pFVar14 != pFVar3) {
          local_c8 = (ulong)(uint)((int)((ulong)((long)(pLVar8->Prologue).IncludeDirectories.
                                                                                                              
                                                  super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pLVar8->Prologue).IncludeDirectories.
                                                                                                            
                                                  super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  -0x55555555);
          uVar13 = 1;
          do {
            if (local_c8 < pFVar14->DirIdx) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              prVar9 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str.Length = 0xc;
              Str.Data = ".debug_line[";
              prVar9 = raw_ostream::operator<<(prVar9,Str);
              DWARFDie::find(&local_100,(DWARFDie *)&FullPathMap.field_0x18,DW_AT_stmt_list);
              if (local_100.Storage.hasVal != true) goto LAB_00b0c6a7;
              OVar15 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_100);
              if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) goto LAB_00b0c6a7;
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_00d77818;
              FullPath._M_string_length = OVar15.Storage.field_0.value;
              prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)local_50);
              Str_00.Length = 0x16;
              Str_00.Data = "].prologue.file_names[";
              prVar9 = raw_ostream::operator<<(prVar9,Str_00);
              prVar9 = raw_ostream::operator<<(prVar9,uVar13);
              Str_01.Length = 0x25;
              Str_01.Data = "].dir_idx contains an invalid index: ";
              prVar9 = raw_ostream::operator<<(prVar9,Str_01);
              prVar9 = raw_ostream::operator<<(prVar9,pFVar14->DirIdx);
              Str_02.Length = 1;
              Str_02.Data = "\n";
              raw_ostream::operator<<(prVar9,Str_02);
            }
            local_50 = (undefined1  [8])&FullPath._M_string_length;
            FullPath._M_dataplus._M_p = (pointer)0x0;
            FullPath._M_string_length = FullPath._M_string_length & 0xffffffffffffff00;
            pcVar10 = DWARFUnit::getCompilationDir((DWARFUnit *)*puVar7);
            if (pcVar10 == (char *)0x0) {
              sVar11 = 0;
            }
            else {
              sVar11 = strlen(pcVar10);
            }
            in_R8 = 2;
            CompDir.Length = sVar11;
            CompDir.Data = pcVar10;
            bVar5 = DWARFDebugLine::Prologue::getFileNameByIndex
                              (&pLVar8->Prologue,uVar13,CompDir,AbsoluteFilePath,(string *)local_50,
                               native);
            if (!bVar5) {
              __assert_fail("HasFullPath && \"Invalid index?\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                            ,0x2da,"void llvm::DWARFVerifier::verifyDebugLineRows()");
            }
            Key.Length = (size_t)FullPath._M_dataplus._M_p;
            Key.Data = (char *)local_50;
            iVar6 = StringMapImpl::FindKey((StringMapImpl *)auStack_a8,Key);
            uVar12 = (long)iVar6;
            if (iVar6 == -1) {
              uVar12 = (ulong)FullPathMap.super_StringMapImpl.TheTable & 0xffffffff;
            }
            if (uVar12 == ((ulong)FullPathMap.super_StringMapImpl.TheTable & 0xffffffff)) {
              Key_00.Length = (size_t)FullPath._M_dataplus._M_p;
              Key_00.Data = (char *)local_50;
              pVar16 = StringMap<unsigned_short,_llvm::MallocAllocator>::try_emplace<>
                                 ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_a8,
                                  Key_00);
              *(short *)(*(long *)pVar16.first.
                                  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                                  .Ptr.
                                  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                        + 8) = (short)uVar13;
            }
            else {
              local_c0 = (StringMapEntryBase **)auStack_a8;
              if ((uint)uVar13 !=
                  (uint)(ushort)(*(StringMapEntryBase **)((long)auStack_a8 + uVar12 * 8))[1].StrLen)
              {
                prVar9 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                            (StringRef)ZEXT816(0),SUB81(in_R8,0));
                Str_03.Length = 0xc;
                Str_03.Data = ".debug_line[";
                local_b8 = raw_ostream::operator<<(prVar9,Str_03);
                DWARFDie::find(&local_100,(DWARFDie *)&FullPathMap.field_0x18,DW_AT_stmt_list);
                if (local_100.Storage.hasVal != true) goto LAB_00b0c6a7;
                OVar15 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_100);
                if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) goto LAB_00b0c6a7;
                local_118.Fmt = "0x%08lx";
                local_118._vptr_format_object_base = (_func_int **)&PTR_home_00d77818;
                local_108.value = OVar15.Storage.field_0.value;
                prVar9 = raw_ostream::operator<<(local_b8,&local_118);
                Str_04.Length = 0x16;
                Str_04.Data = "].prologue.file_names[";
                prVar9 = raw_ostream::operator<<(prVar9,Str_04);
                prVar9 = raw_ostream::operator<<(prVar9,uVar13);
                Str_05.Length = 0x1f;
                Str_05.Data = "] is a duplicate of file_names[";
                prVar9 = raw_ostream::operator<<(prVar9,Str_05);
                prVar9 = raw_ostream::operator<<(prVar9,(ulong)(ushort)local_c0[uVar12][1].StrLen);
                Str_06.Length = 2;
                Str_06.Data = "]\n";
                raw_ostream::operator<<(prVar9,Str_06);
              }
            }
            if (local_50 != (undefined1  [8])&FullPath._M_string_length) {
              operator_delete((void *)local_50,FullPath._M_string_length + 1);
            }
            pFVar14 = pFVar14 + 1;
            uVar13 = (unsigned_long)((uint)uVar13 + 1);
          } while (pFVar14 != pFVar3);
        }
        this_02 = (pLVar8->Rows).
                  super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar4 = (pLVar8->Rows).
                 super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_02 != pRVar4) {
          uVar13 = 0;
          uVar12 = 0;
          do {
            iVar6 = (int)uVar13;
            if ((this_02->Address).Address < uVar12) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              prVar9 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str_07.Length = 0xc;
              Str_07.Data = ".debug_line[";
              prVar9 = raw_ostream::operator<<(prVar9,Str_07);
              DWARFDie::find(&local_100,(DWARFDie *)&FullPathMap.field_0x18,DW_AT_stmt_list);
              if (local_100.Storage.hasVal != true) goto LAB_00b0c6a7;
              OVar15 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_100);
              if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) goto LAB_00b0c6a7;
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_00d77818;
              __n = local_60;
              FullPath._M_string_length = OVar15.Storage.field_0.value;
              prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)local_50);
              Str_08.Length = 6;
              Str_08.Data = "] row[";
              prVar9 = raw_ostream::operator<<(prVar9,Str_08);
              prVar9 = raw_ostream::operator<<(prVar9,uVar13);
              Str_09.Length = 0x2a;
              Str_09.Data = "] decreases in address from previous row:\n";
              raw_ostream::operator<<(prVar9,Str_09);
              DWARFDebugLine::Row::dumpTableHeader(this->OS);
              if (iVar6 != 0) {
                DWARFDebugLine::Row::dump
                          ((pLVar8->Rows).
                           super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                           ._M_impl.super__Vector_impl_data._M_start + (iVar6 - 1),this->OS);
              }
              DWARFDebugLine::Row::dump(this_02,this->OS);
              prVar9 = this->OS;
              pcVar10 = prVar9->OutBufCur;
              if (pcVar10 < prVar9->OutBufEnd) {
                prVar9->OutBufCur = pcVar10 + 1;
                *pcVar10 = '\n';
              }
              else {
                raw_ostream::write(prVar9,10,__buf,(size_t)__n);
              }
            }
            bVar5 = DWARFDebugLine::Prologue::hasFileAtIndex(&pLVar8->Prologue,(ulong)this_02->File)
            ;
            if (!bVar5) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              uVar1 = (pLVar8->Prologue).FormParams.Version;
              prVar9 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str_10.Length = 0xc;
              Str_10.Data = ".debug_line[";
              prVar9 = raw_ostream::operator<<(prVar9,Str_10);
              DWARFDie::find(&local_100,(DWARFDie *)&FullPathMap.field_0x18,DW_AT_stmt_list);
              if (local_100.Storage.hasVal != true) {
LAB_00b0c6a7:
                __assert_fail("hasVal",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                              ,0xad,
                              "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                             );
              }
              OVar15 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_100);
              if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) goto LAB_00b0c6a7;
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_00d77818;
              FullPath._M_string_length = OVar15.Storage.field_0.value;
              prVar9 = raw_ostream::operator<<(prVar9,(format_object_base *)local_50);
              Str_11.Length = 2;
              Str_11.Data = "][";
              prVar9 = raw_ostream::operator<<(prVar9,Str_11);
              prVar9 = raw_ostream::operator<<(prVar9,uVar13);
              Str_12.Length = 0x19;
              Str_12.Data = "] has invalid file index ";
              prVar9 = raw_ostream::operator<<(prVar9,Str_12);
              prVar9 = raw_ostream::operator<<(prVar9,(ulong)this_02->File);
              Str_13.Length = 0x14;
              Str_13.Data = " (valid values are [";
              prVar9 = raw_ostream::operator<<(prVar9,Str_13);
              pcVar10 = "1,";
              if (4 < uVar1) {
                pcVar10 = "0,";
              }
              Str_14.Length = 2;
              Str_14.Data = pcVar10;
              prVar9 = raw_ostream::operator<<(prVar9,Str_14);
              prVar9 = raw_ostream::operator<<
                                 (prVar9,((long)(pLVar8->Prologue).FileNames.
                                                super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pLVar8->Prologue).FileNames.
                                                super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         -0xf0f0f0f0f0f0f0f);
              pcVar10 = " ]";
              __n_00 = ")";
              if (4 < uVar1) {
                pcVar10 = " )";
              }
              Str_15.Data = pcVar10 + 1;
              Str_15.Length = 1;
              prVar9 = raw_ostream::operator<<(prVar9,Str_15);
              Str_16.Length = 3;
              Str_16.Data = "):\n";
              raw_ostream::operator<<(prVar9,Str_16);
              DWARFDebugLine::Row::dumpTableHeader(this->OS);
              DWARFDebugLine::Row::dump(this_02,this->OS);
              prVar9 = this->OS;
              pcVar10 = prVar9->OutBufCur;
              if (pcVar10 < prVar9->OutBufEnd) {
                prVar9->OutBufCur = pcVar10 + 1;
                *pcVar10 = '\n';
              }
              else {
                raw_ostream::write(prVar9,10,__buf_00,(size_t)__n_00);
              }
            }
            if ((this_02->field_0x1d & 4) == 0) {
              uVar12 = (this_02->Address).Address;
            }
            else {
              uVar12 = 0;
            }
            uVar13 = (unsigned_long)(iVar6 + 1);
            this_02 = this_02 + 1;
          } while (this_02 != pRVar4);
        }
        StringMap<unsigned_short,_llvm::MallocAllocator>::~StringMap
                  ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_a8);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_b0);
  }
  return;
}

Assistant:

void DWARFVerifier::verifyDebugLineRows() {
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    // If there is no line table we will have created an error in the
    // .debug_info verifier or in verifyDebugLineStmtOffsets().
    if (!LineTable)
      continue;

    // Verify prologue.
    uint32_t MaxDirIndex = LineTable->Prologue.IncludeDirectories.size();
    uint32_t FileIndex = 1;
    StringMap<uint16_t> FullPathMap;
    for (const auto &FileName : LineTable->Prologue.FileNames) {
      // Verify directory index.
      if (FileName.DirIdx > MaxDirIndex) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "].prologue.file_names[" << FileIndex
                << "].dir_idx contains an invalid index: " << FileName.DirIdx
                << "\n";
      }

      // Check file paths for duplicates.
      std::string FullPath;
      const bool HasFullPath = LineTable->getFileNameByIndex(
          FileIndex, CU->getCompilationDir(),
          DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, FullPath);
      assert(HasFullPath && "Invalid index?");
      (void)HasFullPath;
      auto It = FullPathMap.find(FullPath);
      if (It == FullPathMap.end())
        FullPathMap[FullPath] = FileIndex;
      else if (It->second != FileIndex) {
        warn() << ".debug_line["
               << format("0x%08" PRIx64,
                         *toSectionOffset(Die.find(DW_AT_stmt_list)))
               << "].prologue.file_names[" << FileIndex
               << "] is a duplicate of file_names[" << It->second << "]\n";
      }

      FileIndex++;
    }

    // Verify rows.
    uint64_t PrevAddress = 0;
    uint32_t RowIndex = 0;
    for (const auto &Row : LineTable->Rows) {
      // Verify row address.
      if (Row.Address.Address < PrevAddress) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "] row[" << RowIndex
                << "] decreases in address from previous row:\n";

        DWARFDebugLine::Row::dumpTableHeader(OS);
        if (RowIndex > 0)
          LineTable->Rows[RowIndex - 1].dump(OS);
        Row.dump(OS);
        OS << '\n';
      }

      // Verify file index.
      if (!LineTable->hasFileAtIndex(Row.File)) {
        ++NumDebugLineErrors;
        bool isDWARF5 = LineTable->Prologue.getVersion() >= 5;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "][" << RowIndex << "] has invalid file index " << Row.File
                << " (valid values are [" << (isDWARF5 ? "0," : "1,")
                << LineTable->Prologue.FileNames.size()
                << (isDWARF5 ? ")" : "]") << "):\n";
        DWARFDebugLine::Row::dumpTableHeader(OS);
        Row.dump(OS);
        OS << '\n';
      }
      if (Row.EndSequence)
        PrevAddress = 0;
      else
        PrevAddress = Row.Address.Address;
      ++RowIndex;
    }
  }
}